

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O3

void llvm::format_provider<unsigned_int,_void>::format(uint *V,raw_ostream *Stream,StringRef Style)

{
  bool bVar1;
  HexPrintStyle HVar2;
  size_t MinDigits;
  undefined8 in_R9;
  HexPrintStyle HVar3;
  IntegerStyle Style_00;
  Optional<unsigned_long> Width;
  size_t local_48;
  unsigned_long_long ULLVal;
  undefined1 auStack_38 [4];
  HexPrintStyle HS;
  size_t local_30;
  
  local_30 = Style.Length;
  _auStack_38 = Style.Data;
  bVar1 = detail::HelperFunctions::consumeHexStyle
                    ((StringRef *)auStack_38,(HexPrintStyle *)((long)&ULLVal + 4));
  HVar2 = ULLVal._4_4_;
  if (bVar1) {
    bVar1 = consumeUnsignedInteger((StringRef *)auStack_38,10,&local_48);
    if (bVar1) {
      HVar3 = Upper;
    }
    else {
      HVar3 = (HexPrintStyle)local_48;
    }
    bVar1 = isPrefixedHexStyle(HVar2);
    HVar2 = HVar3 + PrefixUpper;
    if (!bVar1) {
      HVar2 = HVar3;
    }
    Width.Storage._8_8_ = in_R9;
    Width.Storage.field_0.value = 1;
    write_hex((llvm *)Stream,(raw_ostream *)(ulong)*V,(ulong)ULLVal._4_4_,HVar2,Width);
    return;
  }
  Style_00 = Integer;
  if (local_30 != 0) {
    if ((*_auStack_38 == 'N') || (*_auStack_38 == 'n')) {
      Style_00 = Number;
    }
    else {
      if ((*_auStack_38 != 'D') && (Style_00 = Integer, *_auStack_38 != 'd')) goto LAB_00b017a3;
      Style_00 = Integer;
    }
    _auStack_38 = _auStack_38 + 1;
    local_30 = local_30 - 1;
  }
LAB_00b017a3:
  bVar1 = consumeUnsignedInteger((StringRef *)auStack_38,10,&local_48);
  if (local_30 == 0) {
    MinDigits = 0;
    if (!bVar1) {
      MinDigits = local_48;
    }
    write_integer(Stream,*V,MinDigits,Style_00);
    return;
  }
  __assert_fail("Style.empty() && \"Invalid integral format style!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                ,0x93,
                "static void llvm::format_provider<unsigned int>::format(const T &, llvm::raw_ostream &, StringRef) [T = unsigned int, Enable = void]"
               );
}

Assistant:

static void format(const T &V, llvm::raw_ostream &Stream, StringRef Style) {
    HexPrintStyle HS;
    size_t Digits = 0;
    if (consumeHexStyle(Style, HS)) {
      Digits = consumeNumHexDigits(Style, HS, 0);
      write_hex(Stream, V, HS, Digits);
      return;
    }

    IntegerStyle IS = IntegerStyle::Integer;
    if (Style.consume_front("N") || Style.consume_front("n"))
      IS = IntegerStyle::Number;
    else if (Style.consume_front("D") || Style.consume_front("d"))
      IS = IntegerStyle::Integer;

    Style.consumeInteger(10, Digits);
    assert(Style.empty() && "Invalid integral format style!");
    write_integer(Stream, V, Digits, IS);
  }